

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
PS2KeyboardSimulationDataGenerator::SendMovementPacket
          (PS2KeyboardSimulationDataGenerator *this,double MouseType)

{
  SendByte(this,'\b');
  SendByte(this,'\0');
  SendByte(this,'\0');
  if ((MouseType == 1.0) && (!NAN(MouseType))) {
    return;
  }
  SendByte(this,'\0');
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::SendMovementPacket( double MouseType )
{
    if( MouseType == 1 )
    {
        // standard ps/2 mouse sends just 3 bytes of info
        SendByte( 0x08 );
        SendByte( 0x00 );
        SendByte( 0x00 );
    }
    else
    {
        // IntelliMouse sends 4 bytes of info
        SendByte( 0x08 );
        SendByte( 0x00 );
        SendByte( 0x00 );
        SendByte( 0x00 );
    }
}